

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O1

void __thiscall QHeaderViewPrivate::initializeIndexMapping(QHeaderViewPrivate *this)

{
  HeaderMode HVar1;
  pointer piVar2;
  int iVar3;
  int s;
  long lVar4;
  
  HVar1 = this->headerMode;
  if (HVar1 == InitialNoSectionMemoryUsage) {
    iVar3 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar3 = (int)(this->sectionItems).d.size;
  }
  if ((this->visualIndices).d.size == (long)iVar3) {
    if (HVar1 == InitialNoSectionMemoryUsage) {
      iVar3 = (int)this->countInNoSectionItemsMode;
    }
    else {
      iVar3 = (int)(this->sectionItems).d.size;
    }
    if ((this->logicalIndices).d.size == (long)iVar3) {
      return;
    }
  }
  if (HVar1 == InitialNoSectionMemoryUsage) {
    iVar3 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar3 = (int)(this->sectionItems).d.size;
  }
  QList<int>::resize(&this->visualIndices,(long)iVar3);
  if (this->headerMode == InitialNoSectionMemoryUsage) {
    iVar3 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar3 = (int)(this->sectionItems).d.size;
  }
  QList<int>::resize(&this->logicalIndices,(long)iVar3);
  lVar4 = 0;
  while( true ) {
    if (this->headerMode == InitialNoSectionMemoryUsage) {
      iVar3 = (int)this->countInNoSectionItemsMode;
    }
    else {
      iVar3 = (int)(this->sectionItems).d.size;
    }
    if (iVar3 <= lVar4) break;
    piVar2 = QList<int>::data(&this->visualIndices);
    piVar2[lVar4] = (int)lVar4;
    piVar2 = QList<int>::data(&this->logicalIndices);
    piVar2[lVar4] = (int)lVar4;
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

inline void initializeIndexMapping() const {
        if (visualIndices.size() != sectionCount()
            || logicalIndices.size() != sectionCount()) {
            visualIndices.resize(sectionCount());
            logicalIndices.resize(sectionCount());
            for (int s = 0; s < sectionCount(); ++s) {
                visualIndices[s] = s;
                logicalIndices[s] = s;
            }
        }
    }